

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

Num3072 * __thiscall
MuHash3072::ToNum3072(Num3072 *__return_storage_ptr__,MuHash3072 *this,Span<const_unsigned_char> in)

{
  long lVar1;
  HashWriter *this_00;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  Span<std::byte> output;
  Span<const_unsigned_char> in_local;
  ChaCha20Aligned local_1f8;
  uint256 hashed_in;
  uchar tmp [384];
  
  in_local.m_size = in.m_size;
  in_local.m_data = in.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tmp[0x50] = '\0';
  tmp[0x51] = '\0';
  tmp[0x52] = '\0';
  tmp[0x53] = '\0';
  tmp[0x54] = '\0';
  tmp[0x55] = '\0';
  tmp[0x56] = '\0';
  tmp[0x57] = '\0';
  tmp[0x58] = '\0';
  tmp[0x59] = '\0';
  tmp[0x5a] = '\0';
  tmp[0x5b] = '\0';
  tmp[0x5c] = '\0';
  tmp[0x5d] = '\0';
  tmp[0x5e] = '\0';
  tmp[0x5f] = '\0';
  tmp[0x40] = '\0';
  tmp[0x41] = '\0';
  tmp[0x42] = '\0';
  tmp[0x43] = '\0';
  tmp[0x44] = '\0';
  tmp[0x45] = '\0';
  tmp[0x46] = '\0';
  tmp[0x47] = '\0';
  tmp[0x48] = '\0';
  tmp[0x49] = '\0';
  tmp[0x4a] = '\0';
  tmp[0x4b] = '\0';
  tmp[0x4c] = '\0';
  tmp[0x4d] = '\0';
  tmp[0x4e] = '\0';
  tmp[0x4f] = '\0';
  tmp[0x30] = '\0';
  tmp[0x31] = '\0';
  tmp[0x32] = '\0';
  tmp[0x33] = '\0';
  tmp[0x34] = '\0';
  tmp[0x35] = '\0';
  tmp[0x36] = '\0';
  tmp[0x37] = '\0';
  tmp[0x38] = '\0';
  tmp[0x39] = '\0';
  tmp[0x3a] = '\0';
  tmp[0x3b] = '\0';
  tmp[0x3c] = '\0';
  tmp[0x3d] = '\0';
  tmp[0x3e] = '\0';
  tmp[0x3f] = '\0';
  tmp[0x20] = '\0';
  tmp[0x21] = '\0';
  tmp[0x22] = '\0';
  tmp[0x23] = '\0';
  tmp[0x24] = '\0';
  tmp[0x25] = '\0';
  tmp[0x26] = '\0';
  tmp[0x27] = '\0';
  tmp[0x28] = '\0';
  tmp[0x29] = '\0';
  tmp[0x2a] = '\0';
  tmp[0x2b] = '\0';
  tmp[0x2c] = '\0';
  tmp[0x2d] = '\0';
  tmp[0x2e] = '\0';
  tmp[0x2f] = '\0';
  tmp[0x10] = '\0';
  tmp[0x11] = '\0';
  tmp[0x12] = '\0';
  tmp[0x13] = '\0';
  tmp[0x14] = '\0';
  tmp[0x15] = '\0';
  tmp[0x16] = '\0';
  tmp[0x17] = '\0';
  tmp[0x18] = '\0';
  tmp[0x19] = '\0';
  tmp[0x1a] = '\0';
  tmp[0x1b] = '\0';
  tmp[0x1c] = '\0';
  tmp[0x1d] = '\0';
  tmp[0x1e] = '\0';
  tmp[0x1f] = '\0';
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  tmp[4] = '\0';
  tmp[5] = '\0';
  tmp[6] = '\0';
  tmp[7] = '\0';
  tmp[8] = '\0';
  tmp[9] = '\0';
  tmp[10] = '\0';
  tmp[0xb] = '\0';
  tmp[0xc] = '\0';
  tmp[0xd] = '\0';
  tmp[0xe] = '\0';
  tmp[0xf] = '\0';
  tmp[0x60] = '\0';
  tmp[0x61] = '\0';
  tmp[0x62] = '\0';
  tmp[99] = '\0';
  tmp[100] = '\0';
  tmp[0x65] = '\0';
  tmp[0x66] = '\0';
  tmp[0x67] = '\0';
  CSHA256::CSHA256((CSHA256 *)tmp);
  this_00 = HashWriter::operator<<((HashWriter *)tmp,&in_local);
  HashWriter::GetSHA256(&hashed_in,this_00);
  key.m_size = 0x20;
  key.m_data = (byte *)&hashed_in;
  ChaCha20Aligned::ChaCha20Aligned(&local_1f8,key);
  output.m_size = 0x180;
  output.m_data = (byte *)tmp;
  ChaCha20Aligned::Keystream(&local_1f8,output);
  ChaCha20Aligned::~ChaCha20Aligned(&local_1f8);
  Num3072::Num3072(__return_storage_ptr__,&tmp);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Num3072 MuHash3072::ToNum3072(Span<const unsigned char> in) {
    unsigned char tmp[Num3072::BYTE_SIZE];

    uint256 hashed_in{(HashWriter{} << in).GetSHA256()};
    static_assert(sizeof(tmp) % ChaCha20Aligned::BLOCKLEN == 0);
    ChaCha20Aligned{MakeByteSpan(hashed_in)}.Keystream(MakeWritableByteSpan(tmp));
    Num3072 out{tmp};

    return out;
}